

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O3

void __thiscall
wasm::TypeUpdater::noteAddition
          (TypeUpdater *this,Expression *curr,Expression *parent,Expression *previous)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  
  p_Var2 = (this->parents)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var1 = &(this->parents)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      if (*(Expression **)(p_Var2 + 1) >= curr) {
        p_Var3 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(Expression **)(p_Var2 + 1) < curr];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && (*(Expression **)(p_Var3 + 1) <= curr)) {
      __assert_fail("parents.find(curr) == parents.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.h"
                    ,0x96,
                    "void wasm::TypeUpdater::noteAddition(Expression *, Expression *, Expression *)"
                   );
    }
  }
  noteRemovalOrAddition(this,curr,parent);
  if ((previous != (Expression *)0x0) && ((previous->type).id == (curr->type).id)) {
    return;
  }
  propagateTypesUp(this,curr);
  return;
}

Assistant:

void noteAddition(Expression* curr,
                    Expression* parent,
                    Expression* previous = nullptr) {
    assert(parents.find(curr) == parents.end()); // must not already exist
    noteRemovalOrAddition(curr, parent);
    // if we didn't replace with the exact same type, propagate types up
    if (!(previous && previous->type == curr->type)) {
      propagateTypesUp(curr);
    }
  }